

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::ShowEnumOverlay
               (EnumEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  Type TVar1;
  double value;
  char cVar2;
  int iVar3;
  __0 *this;
  runtime_error *this_00;
  char *__s;
  ulong uVar4;
  allocator<char> local_162;
  allocator<char> local_161;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_160;
  allocator<char> local_150 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_130;
  string local_128;
  string local_108 [32];
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string name;
  anon_class_80_3_1ce9ae6c handler;
  
  local_130 = callback;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,(entry->entry).name,(allocator<char> *)&handler);
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar4 = 0; uVar4 < entry->count; uVar4 = uVar4 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&handler,entry->values[uVar4],local_150);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handler);
    std::__cxx11::string::~string((string *)&handler);
  }
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)&handler,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&handler.name,(string *)&name);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&handler.callback,local_130);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_160,&local_c8);
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>(local_108,(entry->entry).name,&local_161);
  switch(TVar1) {
  case Bool:
    cVar2 = (**(code **)(*(long *)local_160._M_ptr + 0x50))
                      (local_160._M_ptr,local_108,(char)entry->count);
    __s = "false";
    if (cVar2 != '\0') {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,local_150);
    break;
  case Int:
    iVar3 = (**(code **)(*(long *)local_160._M_ptr + 0x58))
                      (local_160._M_ptr,local_108,*(undefined4 *)&entry->values);
    std::__cxx11::to_string(&local_128,iVar3);
    break;
  case Double:
    iVar3 = *(int *)&entry->defaultValue;
    value = (double)(**(code **)(*(long *)local_160._M_ptr + 0x60))
                              ((int)*(undefined8 *)&entry[1].entry,local_160._M_ptr,local_108);
    stringValueForDouble_abi_cxx11_(&local_128,value,iVar3);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,(char *)entry->count,&local_162);
    (**(code **)(*(long *)local_160._M_ptr + 0x68))(&local_128,local_160._M_ptr,local_108,local_150)
    ;
    goto LAB_0018d934;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_150,entry->defaultValue,&local_162);
    (**(code **)(*(long *)local_160._M_ptr + 0x68))(&local_128,local_160._M_ptr,local_108,local_150)
    ;
LAB_0018d934:
    std::__cxx11::string::~string((string *)local_150);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type passed to stringValueFor!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  this = (__0 *)operator_new(0x50);
  ShowEnumOverlay(f8n::sdk::ISchema::EnumEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::__0(this,&handler);
  pcStack_d0 = std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:386:20)>
               ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:386:20)>
             ::_M_manager;
  local_e8._M_unused._0_8_ = (undefined8)this;
  ShowListOverlay(&name,&items,&local_128,
                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  ShowEnumOverlay(f8n::sdk::ISchema::EnumEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::~__0((__0 *)&handler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&items);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SchemaOverlay::ShowEnumOverlay(
    const ISchema::EnumEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);
    std::vector<std::string> items;

    for (size_t i = 0; i < entry->count; i++) {
        items.push_back(entry->values[i]);
    }

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetString(name, value.c_str());
        if (callback) { callback(value); }
    };

    ShowListOverlay(name, items, stringValueFor(prefs, entry), handler);
}